

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unittest.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_TestFileVsMessageScope_Test::
TestBody(GeneratedMessageTest_TestFileVsMessageScope_Test *this)

{
  TestConflictingSymbolNames_BadKnownNamesValues TStack_38;
  
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  TestConflictingSymbolNames_BadKnownNamesValues(&TStack_38);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
            (&TStack_38,
             (ExtensionIdentifier<proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
              *)&proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::unknown_fields_);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  ~TestConflictingSymbolNames_BadKnownNamesValues(&TStack_38);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  TestConflictingSymbolNames_BadKnownNamesValues(&TStack_38);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  GetExtension<google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false,_0>
            (&TStack_38,
             (ExtensionIdentifier<proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues,_google::protobuf::internal::PrimitiveTypeTraits<int>,_(unsigned_char)__x05_,_false>
              *)&proto2_unittest::unknown_fields);
  proto2_unittest::TestConflictingSymbolNames_BadKnownNamesValues::
  ~TestConflictingSymbolNames_BadKnownNamesValues(&TStack_38);
  return;
}

Assistant:

TEST(GENERATED_MESSAGE_TEST_NAME, TestFileVsMessageScope) {
  // Special names at message scope are mangled,
  int v [[maybe_unused]] =
      proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::TestConflictingSymbolNames::
                            BadKnownNamesValues::unknown_fields_);
  // But not at file scope.
  v = proto2_unittest::TestConflictingSymbolNames::BadKnownNamesValues()
          .GetExtension(proto2_unittest::unknown_fields);
}